

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_av.c
# Opt level: O0

dtl_av_t * dtl_av_make(dtl_dv_t **ppValue,int32_t s32Len)

{
  int local_2c;
  int32_t s32i;
  dtl_av_t *self;
  int32_t s32Len_local;
  dtl_dv_t **ppValue_local;
  
  if (s32Len < 0) {
    ppValue_local = (dtl_dv_t **)0x0;
  }
  else {
    ppValue_local = (dtl_dv_t **)dtl_av_new();
    if ((dtl_av_t *)ppValue_local != (dtl_av_t *)0x0) {
      dtl_av_extend((dtl_av_t *)ppValue_local,s32Len);
      for (local_2c = 0; local_2c < s32Len; local_2c = local_2c + 1) {
        dtl_av_set((dtl_av_t *)ppValue_local,local_2c,ppValue[local_2c]);
      }
    }
  }
  return (dtl_av_t *)ppValue_local;
}

Assistant:

dtl_av_t* dtl_av_make(dtl_dv_t** ppValue, int32_t s32Len){
   if(s32Len<0){
      return (dtl_av_t*)0;
   }
   dtl_av_t *self = dtl_av_new();
   if(self){
      int32_t s32i;
      dtl_av_extend(self,s32Len);
      for(s32i=0;s32i<s32Len;s32i++){
         dtl_av_set(self,s32i,ppValue[s32i]);
      }
   }
   return self;
}